

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O0

void __thiscall
vkt::image::anon_unknown_0::BufferLoadStoreTestInstance::BufferLoadStoreTestInstance
          (BufferLoadStoreTestInstance *this,Context *context,Texture *texture,VkFormat format,
          VkFormat imageFormat,bool declareImageFormatInShader)

{
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> data;
  Allocator *allocator_00;
  Allocator *device_00;
  VkDevice vk_00;
  Buffer *this_00;
  undefined4 uVar1;
  undefined1 in_stack_fffffffffffffecc [12];
  DefaultDeleter<vkt::image::Buffer> local_b5;
  deUint32 local_b4;
  VkBufferCreateInfo local_b0;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_78;
  PtrData<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *local_68;
  Allocator *local_58;
  Allocator *allocator;
  VkDevice device;
  DeviceInterface *vk;
  undefined1 local_29;
  VkFormat local_28;
  VkFormat VStack_24;
  bool declareImageFormatInShader_local;
  VkFormat imageFormat_local;
  VkFormat format_local;
  Texture *texture_local;
  Context *context_local;
  BufferLoadStoreTestInstance *this_local;
  
  uVar1 = 0;
  local_29 = declareImageFormatInShader;
  local_28 = imageFormat;
  VStack_24 = format;
  _imageFormat_local = texture;
  texture_local = (Texture *)context;
  context_local = (Context *)this;
  LoadStoreTestInstance::LoadStoreTestInstance
            (&this->super_LoadStoreTestInstance,context,texture,format,imageFormat,
             declareImageFormatInShader,false);
  (this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__BufferLoadStoreTestInstance_0166bfd8;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            (&this->m_imageBufferDst);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)19>_>::Move(&this->m_descriptorSetLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)21>_>::Move(&this->m_descriptorPool);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)22>_>::Move(&this->m_descriptorSet);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::Move(&this->m_bufferViewSrc);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)12>_>::Move(&this->m_bufferViewDst);
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_LoadStoreTestInstance).super_BaseTestInstance.super_TestInstance.
                      m_context);
  allocator = (Allocator *)
              Context::getDevice((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                                 super_TestInstance.m_context);
  local_58 = Context::getDefaultAllocator
                       ((this->super_LoadStoreTestInstance).super_BaseTestInstance.
                        super_TestInstance.m_context);
  this_00 = (Buffer *)operator_new(0x30);
  vk_00 = device;
  device_00 = allocator;
  allocator_00 = local_58;
  makeBufferCreateInfo(&local_b0,(this->super_LoadStoreTestInstance).m_imageSizeBytes,8);
  local_b4 = ::vk::MemoryRequirement::HostVisible.m_flags;
  image::Buffer::Buffer
            (this_00,(DeviceInterface *)vk_00,(VkDevice)device_00,allocator_00,&local_b0,
             ::vk::MemoryRequirement::HostVisible);
  de::DefaultDeleter<vkt::image::Buffer>::DefaultDeleter(&local_b5);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_78);
  local_68 = de::details::MovePtr::operator_cast_to_PtrData(&local_78,(MovePtr *)this_00);
  data._4_12_ = in_stack_fffffffffffffecc;
  data.ptr._0_4_ = uVar1;
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::operator=
            (&this->m_imageBufferDst,data);
  de::details::MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::~MovePtr
            ((MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *)&local_78);
  return;
}

Assistant:

BufferLoadStoreTestInstance::BufferLoadStoreTestInstance (Context&			context,
														  const Texture&	texture,
														  const VkFormat	format,
														  const VkFormat	imageFormat,
														  const bool		declareImageFormatInShader)
	: LoadStoreTestInstance(context, texture, format, imageFormat, declareImageFormatInShader, false)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	Allocator&				allocator	= m_context.getDefaultAllocator();

	// Create a destination buffer.

	m_imageBufferDst = de::MovePtr<Buffer>(new Buffer(
		vk, device, allocator,
		makeBufferCreateInfo(m_imageSizeBytes, VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT),
		MemoryRequirement::HostVisible));
}